

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

size_t __thiscall opengv::math::Sturm::evaluateChain(Sturm *this,double bound)

{
  bool bVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  Scalar *pSVar2;
  size_t sVar3;
  long in_RDI;
  double in_XMM0_Qa;
  size_t i_2;
  int signChanges;
  bool positive;
  size_t i_1;
  MatrixXd signs;
  size_t i;
  MatrixXd monomials;
  DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>_>
  *in_stack_fffffffffffffe18;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffe20;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
  *in_stack_fffffffffffffe28;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
  *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe38;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffe40;
  Scalar *in_stack_fffffffffffffe48;
  undefined1 *startRow;
  ulong local_198;
  int local_190;
  ulong local_70;
  ulong local_48;
  undefined1 local_28 [24];
  double local_10;
  
  startRow = local_28;
  local_10 = in_XMM0_Qa;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
             (int *)in_stack_fffffffffffffe30);
  this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                      (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b558);
  *(Scalar *)this_00 = 1.0;
  for (local_48 = 2; local_48 <= *(ulong *)(in_RDI + 0x20); local_48 = local_48 + 1) {
    in_stack_fffffffffffffe48 =
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b5bb);
    in_stack_fffffffffffffe38 = (double *)(*in_stack_fffffffffffffe48 * local_10);
    in_stack_fffffffffffffe40 =
         (Matrix<double,__1,__1,_0,__1,__1> *)
         Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                   (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b603);
    (in_stack_fffffffffffffe40->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = in_stack_fffffffffffffe38;
  }
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
             (int *)in_stack_fffffffffffffe30);
  for (local_70 = 0; local_70 < *(ulong *)(in_RDI + 0x20); local_70 = local_70 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,unsigned_long>
              (this_00,(Index)startRow,in_RDI,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (unsigned_long)in_stack_fffffffffffffe40);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<unsigned_long,int>
              (this_00,(Index)startRow,in_RDI,(unsigned_long)in_stack_fffffffffffffe48,
               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::operator*
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
              (this_00,(Index)startRow,in_RDI,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
               (int)in_stack_fffffffffffffe48);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
               in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b7b7);
  bVar1 = 0.0 < *pSVar2;
  local_190 = 0;
  for (local_198 = 1; local_198 < *(ulong *)(in_RDI + 0x20); local_198 = local_198 + 1) {
    if (bVar1) {
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b818);
      if (*pSVar2 < 0.0) {
        local_190 = local_190 + 1;
        bVar1 = false;
      }
    }
    else {
      in_stack_fffffffffffffe20 =
           (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffe20,(Index)in_stack_fffffffffffffe18,0x128b856);
      if (0.0 < *(double *)in_stack_fffffffffffffe20) {
        local_190 = local_190 + 1;
        bVar1 = true;
      }
    }
  }
  sVar3 = (size_t)local_190;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x128b8ad);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x128b8ba);
  return sVar3;
}

Assistant:

size_t
opengv::math::Sturm::evaluateChain( double bound )
{
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;
  
  //evaluate all monomials at the bound
  for(size_t i = 2; i <= _dimension; i++)
    monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*bound;
  
  Eigen::MatrixXd signs(_dimension,1);
  for( size_t i = 0; i < _dimension; i++ )
    signs.block(i,0,1,1) = _C.block(i,i,1,_dimension-i) * monomials.block(i,0,_dimension-i,1);
  
  bool positive = false;
  if( signs(0,0) > 0.0 )
    positive = true;
  
  int signChanges = 0;
  
  for( size_t i = 1; i < _dimension; i++ )
  {
    if( positive )
    {
      if( signs(i,0) < 0.0 )
      {
        signChanges++;
        positive = false;
      }
    }
    else
    {
      if( signs(i,0) > 0.0 )
      {
        signChanges++;
        positive = true;
      }
    }
  }
  
  return signChanges;
}